

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O3

void ZSTD_rescaleFreqs(optState_t *optPtr,BYTE *src,size_t srcSize,int optLevel)

{
  uint *puVar1;
  short sVar2;
  ZSTD_literalCompressionMode_e ZVar3;
  uint *puVar4;
  undefined1 auVar5 [16];
  undefined8 in_RAX;
  ZSTD_entropyCTables_t *pZVar6;
  long lVar7;
  U32 UVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined1 auVar14 [16];
  uint uVar15;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  undefined1 auVar16 [16];
  undefined1 auVar20 [16];
  uint lit;
  undefined8 uStack_28;
  
  ZVar3 = optPtr->literalCompressionMode;
  optPtr->priceType = zop_dynamic;
  uStack_28 = in_RAX;
  if (optPtr->litLengthSum == 0) {
    if (srcSize < 0x401) {
      optPtr->priceType = zop_predef;
    }
    pZVar6 = optPtr->symbolCosts;
    if ((pZVar6->huf).repeatMode == HUF_repeat_valid) {
      optPtr->priceType = zop_dynamic;
      if (ZVar3 != ZSTD_lcm_uncompressed) {
        optPtr->litSum = 0;
        lVar7 = 0;
        do {
          UVar8 = HUF_getNbBits(optPtr->symbolCosts,(U32)lVar7);
          uVar15 = 1 << (0xbU - (char)UVar8 & 0x1f);
          if (UVar8 == 0) {
            uVar15 = 1;
          }
          optPtr->litFreq[lVar7] = uVar15;
          optPtr->litSum = optPtr->litSum + uVar15;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x100);
        pZVar6 = optPtr->symbolCosts;
      }
      sVar2 = (short)(pZVar6->fse).litlengthCTable[0];
      lVar7 = 1;
      if (sVar2 != 0) {
        lVar7 = (long)(1 << ((char)sVar2 - 1U & 0x1f));
      }
      optPtr->litLengthSum = 0;
      puVar4 = optPtr->litLengthFreq;
      lVar9 = 0;
      do {
        uVar15 = (pZVar6->fse).litlengthCTable[lVar7 + lVar9 * 2 + 2] + 0xffff;
        uVar17 = 1 << (10U - (char)(uVar15 >> 0x10) & 0x1f);
        if (uVar15 < 0x10000) {
          uVar17 = 1;
        }
        puVar4[lVar9] = uVar17;
        optPtr->litLengthSum = optPtr->litLengthSum + uVar17;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x24);
      sVar2 = (short)(pZVar6->fse).matchlengthCTable[0];
      lVar7 = 1;
      if (sVar2 != 0) {
        lVar7 = (long)(1 << ((char)sVar2 - 1U & 0x1f));
      }
      optPtr->matchLengthSum = 0;
      puVar4 = optPtr->matchLengthFreq;
      lVar9 = 0;
      do {
        uVar15 = (pZVar6->fse).matchlengthCTable[lVar7 + lVar9 * 2 + 2] + 0xffff;
        uVar17 = 1 << (10U - (char)(uVar15 >> 0x10) & 0x1f);
        if (uVar15 < 0x10000) {
          uVar17 = 1;
        }
        puVar4[lVar9] = uVar17;
        optPtr->matchLengthSum = optPtr->matchLengthSum + uVar17;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x35);
      sVar2 = (short)(pZVar6->fse).offcodeCTable[0];
      lVar7 = 1;
      if (sVar2 != 0) {
        lVar7 = (long)(1 << ((char)sVar2 - 1U & 0x1f));
      }
      optPtr->offCodeSum = 0;
      puVar4 = optPtr->offCodeFreq;
      lVar9 = 0;
      do {
        uVar15 = (pZVar6->fse).offcodeCTable[lVar7 + lVar9 * 2 + 2] + 0xffff;
        uVar17 = 1 << (10U - (char)(uVar15 >> 0x10) & 0x1f);
        if (uVar15 < 0x10000) {
          uVar17 = 1;
        }
        puVar4[lVar9] = uVar17;
        optPtr->offCodeSum = optPtr->offCodeSum + uVar17;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x20);
      goto LAB_00136eb8;
    }
    if (ZVar3 != ZSTD_lcm_uncompressed) {
      uStack_28 = CONCAT44(0xff,(int)in_RAX);
      HIST_count_simple(optPtr->litFreq,(uint *)((long)&uStack_28 + 4),src,srcSize);
      puVar4 = optPtr->litFreq;
      iVar10 = 0;
      iVar11 = 0;
      iVar12 = 0;
      iVar13 = 0;
      lVar7 = 0;
      do {
        puVar1 = puVar4 + lVar7;
        uVar15 = (*puVar1 >> 5) + 1;
        uVar17 = (puVar1[1] >> 5) + 1;
        uVar18 = (puVar1[2] >> 5) + 1;
        uVar19 = (puVar1[3] >> 5) + 1;
        puVar1 = puVar4 + lVar7;
        *puVar1 = uVar15;
        puVar1[1] = uVar17;
        puVar1[2] = uVar18;
        puVar1[3] = uVar19;
        iVar10 = iVar10 + uVar15;
        iVar11 = iVar11 + uVar17;
        iVar12 = iVar12 + uVar18;
        iVar13 = iVar13 + uVar19;
        lVar7 = lVar7 + 4;
      } while (lVar7 != 0x100);
      optPtr->litSum = iVar13 + iVar11 + iVar12 + iVar10;
    }
    puVar4 = optPtr->litLengthFreq;
    lVar7 = 0;
    do {
      puVar1 = puVar4 + lVar7;
      puVar1[0] = 1;
      puVar1[1] = 1;
      puVar1[2] = 1;
      puVar1[3] = 1;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x24);
    optPtr->litLengthSum = 0x24;
    auVar5 = _DAT_0015c8b0;
    puVar4 = optPtr->matchLengthFreq;
    lVar7 = 3;
    auVar14 = _DAT_0015dcd0;
    auVar16 = _DAT_0015dce0;
    do {
      auVar20 = auVar16 ^ auVar5;
      if (auVar20._4_4_ == -0x80000000 && auVar20._0_4_ < -0x7fffffcb) {
        puVar4[lVar7 + -3] = 1;
        puVar4[lVar7 + -2] = 1;
      }
      auVar20 = auVar14 ^ auVar5;
      if (auVar20._4_4_ == -0x80000000 && auVar20._0_4_ < -0x7fffffcb) {
        puVar4[lVar7 + -1] = 1;
        puVar4[lVar7] = 1;
      }
      lVar9 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 4;
      auVar16._8_8_ = lVar9 + 4;
      lVar9 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 4;
      auVar14._8_8_ = lVar9 + 4;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x3b);
    optPtr->matchLengthSum = 0x35;
    puVar4 = optPtr->offCodeFreq;
    lVar7 = 0;
    do {
      puVar1 = puVar4 + lVar7;
      puVar1[0] = 1;
      puVar1[1] = 1;
      puVar1[2] = 1;
      puVar1[3] = 1;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x20);
    UVar8 = 0x20;
  }
  else {
    if (ZVar3 != ZSTD_lcm_uncompressed) {
      puVar4 = optPtr->litFreq;
      iVar10 = 0;
      iVar11 = 0;
      iVar12 = 0;
      iVar13 = 0;
      lVar7 = 0;
      do {
        puVar1 = puVar4 + lVar7;
        uVar15 = (*puVar1 >> 5) + 1;
        uVar17 = (puVar1[1] >> 5) + 1;
        uVar18 = (puVar1[2] >> 5) + 1;
        uVar19 = (puVar1[3] >> 5) + 1;
        puVar1 = puVar4 + lVar7;
        *puVar1 = uVar15;
        puVar1[1] = uVar17;
        puVar1[2] = uVar18;
        puVar1[3] = uVar19;
        iVar10 = iVar10 + uVar15;
        iVar11 = iVar11 + uVar17;
        iVar12 = iVar12 + uVar18;
        iVar13 = iVar13 + uVar19;
        lVar7 = lVar7 + 4;
      } while (lVar7 != 0x100);
      optPtr->litSum = iVar13 + iVar11 + iVar12 + iVar10;
    }
    puVar4 = optPtr->litLengthFreq;
    iVar10 = 0;
    iVar11 = 0;
    iVar12 = 0;
    iVar13 = 0;
    lVar7 = 0;
    do {
      puVar1 = puVar4 + lVar7;
      uVar15 = (*puVar1 >> 4) + 1;
      uVar17 = (puVar1[1] >> 4) + 1;
      uVar18 = (puVar1[2] >> 4) + 1;
      uVar19 = (puVar1[3] >> 4) + 1;
      puVar1 = puVar4 + lVar7;
      *puVar1 = uVar15;
      puVar1[1] = uVar17;
      puVar1[2] = uVar18;
      puVar1[3] = uVar19;
      iVar10 = iVar10 + uVar15;
      iVar11 = iVar11 + uVar17;
      iVar12 = iVar12 + uVar18;
      iVar13 = iVar13 + uVar19;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x24);
    optPtr->litLengthSum = iVar13 + iVar11 + iVar12 + iVar10;
    puVar4 = optPtr->matchLengthFreq;
    lVar7 = 0;
    UVar8 = 0;
    do {
      uVar15 = puVar4[lVar7] >> 4;
      puVar4[lVar7] = uVar15 + 1;
      UVar8 = UVar8 + uVar15 + 1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x35);
    optPtr->matchLengthSum = UVar8;
    puVar4 = optPtr->offCodeFreq;
    iVar10 = 0;
    iVar11 = 0;
    iVar12 = 0;
    iVar13 = 0;
    lVar7 = 0;
    do {
      puVar1 = puVar4 + lVar7;
      uVar15 = (*puVar1 >> 4) + 1;
      uVar17 = (puVar1[1] >> 4) + 1;
      uVar18 = (puVar1[2] >> 4) + 1;
      uVar19 = (puVar1[3] >> 4) + 1;
      puVar1 = puVar4 + lVar7;
      *puVar1 = uVar15;
      puVar1[1] = uVar17;
      puVar1[2] = uVar18;
      puVar1[3] = uVar19;
      iVar10 = iVar10 + uVar15;
      iVar11 = iVar11 + uVar17;
      iVar12 = iVar12 + uVar18;
      iVar13 = iVar13 + uVar19;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x20);
    UVar8 = iVar13 + iVar11 + iVar12 + iVar10;
  }
  optPtr->offCodeSum = UVar8;
LAB_00136eb8:
  ZSTD_setBasePrices(optPtr,optLevel);
  return;
}

Assistant:

static void
ZSTD_rescaleFreqs(optState_t* const optPtr,
            const BYTE* const src, size_t const srcSize,
                  int const optLevel)
{
    int const compressedLiterals = ZSTD_compressedLiterals(optPtr);
    DEBUGLOG(5, "ZSTD_rescaleFreqs (srcSize=%u)", (unsigned)srcSize);
    optPtr->priceType = zop_dynamic;

    if (optPtr->litLengthSum == 0) {  /* first block : init */
        if (srcSize <= ZSTD_PREDEF_THRESHOLD) {  /* heuristic */
            DEBUGLOG(5, "(srcSize <= ZSTD_PREDEF_THRESHOLD) => zop_predef");
            optPtr->priceType = zop_predef;
        }

        assert(optPtr->symbolCosts != NULL);
        if (optPtr->symbolCosts->huf.repeatMode == HUF_repeat_valid) {
            /* huffman table presumed generated by dictionary */
            optPtr->priceType = zop_dynamic;

            if (compressedLiterals) {
                unsigned lit;
                assert(optPtr->litFreq != NULL);
                optPtr->litSum = 0;
                for (lit=0; lit<=MaxLit; lit++) {
                    U32 const scaleLog = 11;   /* scale to 2K */
                    U32 const bitCost = HUF_getNbBits(optPtr->symbolCosts->huf.CTable, lit);
                    assert(bitCost <= scaleLog);
                    optPtr->litFreq[lit] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litSum += optPtr->litFreq[lit];
            }   }

            {   unsigned ll;
                FSE_CState_t llstate;
                FSE_initCState(&llstate, optPtr->symbolCosts->fse.litlengthCTable);
                optPtr->litLengthSum = 0;
                for (ll=0; ll<=MaxLL; ll++) {
                    U32 const scaleLog = 10;   /* scale to 1K */
                    U32 const bitCost = FSE_getMaxNbBits(llstate.symbolTT, ll);
                    assert(bitCost < scaleLog);
                    optPtr->litLengthFreq[ll] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litLengthSum += optPtr->litLengthFreq[ll];
            }   }

            {   unsigned ml;
                FSE_CState_t mlstate;
                FSE_initCState(&mlstate, optPtr->symbolCosts->fse.matchlengthCTable);
                optPtr->matchLengthSum = 0;
                for (ml=0; ml<=MaxML; ml++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(mlstate.symbolTT, ml);
                    assert(bitCost < scaleLog);
                    optPtr->matchLengthFreq[ml] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->matchLengthSum += optPtr->matchLengthFreq[ml];
            }   }

            {   unsigned of;
                FSE_CState_t ofstate;
                FSE_initCState(&ofstate, optPtr->symbolCosts->fse.offcodeCTable);
                optPtr->offCodeSum = 0;
                for (of=0; of<=MaxOff; of++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(ofstate.symbolTT, of);
                    assert(bitCost < scaleLog);
                    optPtr->offCodeFreq[of] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->offCodeSum += optPtr->offCodeFreq[of];
            }   }

        } else {  /* not a dictionary */

            assert(optPtr->litFreq != NULL);
            if (compressedLiterals) {
                unsigned lit = MaxLit;
                HIST_count_simple(optPtr->litFreq, &lit, src, srcSize);   /* use raw first block to init statistics */
                optPtr->litSum = ZSTD_downscaleStat(optPtr->litFreq, MaxLit, 1);
            }

            {   unsigned ll;
                for (ll=0; ll<=MaxLL; ll++)
                    optPtr->litLengthFreq[ll] = 1;
            }
            optPtr->litLengthSum = MaxLL+1;

            {   unsigned ml;
                for (ml=0; ml<=MaxML; ml++)
                    optPtr->matchLengthFreq[ml] = 1;
            }
            optPtr->matchLengthSum = MaxML+1;

            {   unsigned of;
                for (of=0; of<=MaxOff; of++)
                    optPtr->offCodeFreq[of] = 1;
            }
            optPtr->offCodeSum = MaxOff+1;

        }

    } else {   /* new block : re-use previous statistics, scaled down */

        if (compressedLiterals)
            optPtr->litSum = ZSTD_downscaleStat(optPtr->litFreq, MaxLit, 1);
        optPtr->litLengthSum = ZSTD_downscaleStat(optPtr->litLengthFreq, MaxLL, 0);
        optPtr->matchLengthSum = ZSTD_downscaleStat(optPtr->matchLengthFreq, MaxML, 0);
        optPtr->offCodeSum = ZSTD_downscaleStat(optPtr->offCodeFreq, MaxOff, 0);
    }

    ZSTD_setBasePrices(optPtr, optLevel);
}